

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QLine *p)

{
  long lVar1;
  QPoint QVar2;
  QPoint *pQVar3;
  long in_FS_OFFSET;
  QPoint local_48;
  QDebug local_40;
  QPoint local_38;
  QDebug local_30;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)p);
  *(undefined1 *)((long)p->pt1 + 0x30) = 0;
  pQVar3 = (QPoint *)QDebug::operator<<((QDebug *)p,"QLine(");
  local_48 = *pQVar3;
  *(int *)((long)local_48 + 0x28) = *(int *)((long)local_48 + 0x28) + 1;
  operator<<((Stream *)&local_40,&local_48);
  pQVar3 = (QPoint *)QDebug::operator<<(&local_40,',');
  local_38 = *pQVar3;
  *(int *)((long)local_38 + 0x28) = *(int *)((long)local_38 + 0x28) + 1;
  operator<<((Stream *)&local_30,&local_38);
  QDebug::operator<<(&local_30,')');
  QDebug::~QDebug(&local_30);
  QDebug::~QDebug((QDebug *)&local_38);
  QDebug::~QDebug(&local_40);
  QDebug::~QDebug((QDebug *)&local_48);
  QVar2 = p->pt1;
  (p->pt1).xp = 0;
  (p->pt1).yp = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)QVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QLine &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QLine(" << p.p1() << ',' << p.p2() << ')';
    return dbg;
}